

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

json __thiscall
server_task_result_cmpl_final::to_json_abi_cxx11_(server_task_result_cmpl_final *this)

{
  int iVar1;
  json_value jVar2;
  json_value extraout_RDX;
  long in_RSI;
  undefined8 in_RDI;
  json jVar3;
  server_task_result_cmpl_final *in_stack_00000b58;
  server_task_result_cmpl_final *in_stack_00000bb8;
  server_task_result_cmpl_final *in_stack_00000d38;
  server_task_result_cmpl_final *in_stack_000013f8;
  
  iVar1 = *(int *)(in_RSI + 0x7f4);
  if (iVar1 == 0) {
    jVar3 = to_json_non_oaicompat_abi_cxx11_(in_stack_00000bb8);
    jVar2 = jVar3.m_data.m_value;
  }
  else if (iVar1 == 1) {
    if ((*(byte *)(in_RSI + 0x50) & 1) == 0) {
      jVar3 = to_json_oaicompat_chat_abi_cxx11_(in_stack_000013f8);
      jVar2 = jVar3.m_data.m_value;
    }
    else {
      jVar3 = to_json_oaicompat_chat_stream_abi_cxx11_(in_stack_00000b58);
      jVar2 = jVar3.m_data.m_value;
    }
  }
  else if (iVar1 == 2) {
    jVar3 = to_json_oaicompat_abi_cxx11_(in_stack_00000d38);
    jVar2 = jVar3.m_data.m_value;
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/server/server.cpp"
               ,0x296,"GGML_ASSERT(%s) failed","false && \"Invalid oaicompat_type\"");
    jVar2 = extraout_RDX;
  }
  jVar3.m_data.m_value.object = jVar2.object;
  jVar3.m_data._0_8_ = in_RDI;
  return (json)jVar3.m_data;
}

Assistant:

virtual json to_json() override {
        switch (oaicompat) {
            case OAICOMPAT_TYPE_NONE:
                return to_json_non_oaicompat();
            case OAICOMPAT_TYPE_COMPLETION:
                return to_json_oaicompat();
            case OAICOMPAT_TYPE_CHAT:
                return stream ? to_json_oaicompat_chat_stream() : to_json_oaicompat_chat();
            default:
                GGML_ASSERT(false && "Invalid oaicompat_type");
        }
    }